

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>::templated_iterator<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
::emplace_new_key<slang::ConstantValue&,slang::SourceRange_const&>
          (sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,ConstantValue *key,
          SourceRange *args)

{
  SourceLocation SVar1;
  long lVar2;
  long lVar3;
  char __tmp;
  ulong uVar4;
  undefined7 in_register_00000031;
  pair<slang::ConstantValue,_slang::SourceRange> *__p;
  EntryPointer psVar5;
  EntryPointer psVar6;
  int8_t iVar7;
  sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
  sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>::templated_iterator<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_bool>
  pVar11;
  value_type to_insert;
  pair<slang::ConstantValue,_slang::SourceRange> pStack_68;
  
  if (*(long *)(this + 0x10) != 0) {
    uVar4 = CONCAT71(in_register_00000031,distance_from_desired) & 0xffffffff;
    sVar8 = SUB81(uVar4,0);
    if (this[0x19] != sVar8) {
      lVar3 = *(long *)(this + 0x20) + 1;
      auVar9._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar9._0_8_ = lVar3;
      auVar9._12_4_ = 0x45300000;
      lVar2 = *(long *)(this + 0x10) + 1;
      auVar10._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar10._0_8_ = lVar2;
      auVar10._12_4_ = 0x45300000;
      if ((auVar9._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) <=
          (double)*(float *)(this + 0x1c) *
          ((auVar10._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0))) {
        if (-1 < current_entry->distance_from_desired) {
          std::__detail::__variant::
          _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&pStack_68,
                            (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)key);
          pStack_68.second.startLoc = args->startLoc;
          pStack_68.second.endLoc = args->endLoc;
          iVar7 = current_entry->distance_from_desired;
          current_entry->distance_from_desired = (int8_t)sVar8;
          __p = (pair<slang::ConstantValue,_slang::SourceRange> *)&current_entry->field_1;
          psVar5 = current_entry;
          do {
            std::pair<slang::ConstantValue,_slang::SourceRange>::swap(&pStack_68,__p);
            sVar8 = (sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
                     )(iVar7 + '\x01');
            psVar6 = psVar5;
LAB_0030eefa:
            psVar5 = psVar6 + 1;
            iVar7 = psVar5->distance_from_desired;
            if (iVar7 < '\0') {
              std::pair<slang::ConstantValue,_slang::SourceRange>::pair
                        (&psVar6[1].field_1.value,&pStack_68);
              psVar5->distance_from_desired = (int8_t)sVar8;
              *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
              uVar4 = CONCAT71((uint7)((ulong)&pStack_68 >> 8) & 0xffffff,1);
              goto LAB_0030ef86;
            }
            if ((char)sVar8 <= iVar7) goto code_r0x0030ef08;
            psVar5->distance_from_desired = (int8_t)sVar8;
            __p = (pair<slang::ConstantValue,_slang::SourceRange> *)&psVar6[1].field_1;
          } while( true );
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&(current_entry->field_1).value,
                          (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)key);
        SVar1 = args->endLoc;
        (current_entry->field_1).value.second.startLoc = args->startLoc;
        (current_entry->field_1).value.second.endLoc = SVar1;
        current_entry->distance_from_desired = (int8_t)sVar8;
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
        uVar4 = CONCAT71((int7)(uVar4 >> 8),1);
        goto LAB_0030ee9f;
      }
    }
  }
  sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
  ::grow((sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
          *)this);
  pVar11 = emplace<slang::ConstantValue&,slang::SourceRange_const&>(this,key,args);
  current_entry = (EntryPointer)pVar11.first.current;
  uVar4 = (ulong)pVar11._8_4_;
LAB_0030ee9f:
  pVar11._8_8_ = uVar4;
  pVar11.first.current = current_entry;
  return pVar11;
code_r0x0030ef08:
  sVar8 = (sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
           )((char)sVar8 + '\x01');
  psVar6 = psVar5;
  if (this[0x19] == sVar8) {
    std::pair<slang::ConstantValue,_slang::SourceRange>::swap
              (&pStack_68,&(current_entry->field_1).value);
    sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
    ::grow((sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
            *)this);
    pVar11 = emplace<std::pair<slang::ConstantValue,slang::SourceRange>>(this,&pStack_68);
    current_entry = (EntryPointer)pVar11.first.current;
    uVar4 = (ulong)pVar11._8_4_;
LAB_0030ef86:
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&pStack_68);
    goto LAB_0030ee9f;
  }
  goto LAB_0030eefa;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }